

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

ClippedEdge *
MutableS2ShapeIndex::ClipUBound(ClippedEdge *edge,int u_end,double u,EdgeAllocator *alloc)

{
  FaceEdge *pFVar1;
  R1Interval *pRVar2;
  ClippedEdge *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int v_end;
  double v;
  FaceEdge *e;
  EdgeAllocator *alloc_local;
  double u_local;
  int u_end_local;
  ClippedEdge *edge_local;
  
  if (u_end == 0) {
    pRVar2 = R2Rect::operator[](&edge->bound,0);
    dVar4 = R1Interval::lo(pRVar2);
    if (u <= dVar4) {
      return edge;
    }
  }
  else {
    pRVar2 = R2Rect::operator[](&edge->bound,0);
    dVar4 = R1Interval::hi(pRVar2);
    if (dVar4 <= u) {
      return edge;
    }
  }
  pFVar1 = edge->face_edge;
  pRVar2 = R2Rect::operator[](&edge->bound,1);
  dVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,0);
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,0);
  dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,1);
  dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,1);
  dVar4 = S2::InterpolateDouble(u,dVar4,dVar5,dVar6,dVar7);
  dVar4 = R1Interval::Project(pRVar2,dVar4);
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,0);
  dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,0);
  dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,1);
  dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,1);
  pCVar3 = UpdateBound(edge,u_end,u,u_end ^ (uint)(dVar6 < dVar5 != dVar8 < dVar7),dVar4,alloc);
  return pCVar3;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipUBound(const ClippedEdge* edge, int u_end, double u,
                                EdgeAllocator* alloc) {
  // First check whether the edge actually requires any clipping.  (Sometimes
  // this method is called when clipping is not necessary, e.g. when one edge
  // endpoint is in the overlap area between two padded child cells.)
  if (u_end == 0) {
    if (edge->bound[0].lo() >= u) return edge;
  } else {
    if (edge->bound[0].hi() <= u) return edge;
  }
  // We interpolate the new v-value from the endpoints of the original edge.
  // This has two advantages: (1) we don't need to store the clipped endpoints
  // at all, just their bounding box; and (2) it avoids the accumulation of
  // roundoff errors due to repeated interpolations.  The result needs to be
  // clamped to ensure that it is in the appropriate range.
  const FaceEdge& e = *edge->face_edge;
  double v = edge->bound[1].Project(
      S2::InterpolateDouble(u, e.a[0], e.b[0], e.a[1], e.b[1]));

  // Determine which endpoint of the v-axis bound to update.  If the edge
  // slope is positive we update the same endpoint, otherwise we update the
  // opposite endpoint.
  int v_end = u_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}